

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl.cpp
# Opt level: O0

void __thiscall pg::DTLSolver::run(DTLSolver *this)

{
  pointer piVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool bVar7;
  bool bVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong *puVar12;
  int *piVar13;
  size_t sVar14;
  long lVar15;
  long lVar16;
  uintqueue *puVar17;
  uint *puVar18;
  uint *puVar19;
  ostream *poVar20;
  void *pvVar21;
  Error *pEVar22;
  reference ppiVar23;
  vector<int,_std::allocator<int>_> *this_00;
  vector<int,_std::allocator<int>_> *pvVar24;
  ulong uVar25;
  vector<int,_std::allocator<int>_> *local_118;
  int **x_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<int_*,_std::allocator<int_*>_> *__range1_1;
  int **x;
  iterator __end1;
  iterator __begin1;
  vector<int_*,_std::allocator<int_*>_> *__range1;
  int i;
  int local_a0;
  bool found1;
  int iStack_9c;
  bool found0;
  int odd_iterations;
  int even_iterations;
  int local_84;
  DTLSolver *pDStack_80;
  int v;
  DTLSolver *this_local;
  uintqueue *local_70;
  uint local_64;
  uintqueue *local_60;
  uint local_54;
  uintqueue *local_50;
  uint local_44;
  uintqueue *local_40;
  uint local_34;
  uintqueue *local_30;
  uint local_24;
  uintqueue *local_20;
  uint local_14;
  uintqueue *local_10;
  
  pDStack_80 = this;
  uVar10 = Solver::nodecount(&this->super_Solver);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar10;
  uVar11 = SUB168(auVar2 * ZEXT816(0x18),0);
  uVar25 = uVar11 + 8;
  if (SUB168(auVar2 * ZEXT816(0x18),8) != 0 || 0xfffffffffffffff7 < uVar11) {
    uVar25 = 0xffffffffffffffff;
  }
  puVar12 = (ulong *)operator_new__(uVar25);
  *puVar12 = uVar10;
  pvVar24 = (vector<int,_std::allocator<int>_> *)(puVar12 + 1);
  if (uVar10 != 0) {
    local_118 = pvVar24;
    do {
      std::vector<int,_std::allocator<int>_>::vector(local_118);
      local_118 = local_118 + 1;
    } while (local_118 != pvVar24 + uVar10);
  }
  this->tin = pvVar24;
  uVar10 = Solver::nodecount(&this->super_Solver);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar10;
  uVar10 = SUB168(auVar3 * ZEXT816(4),0);
  if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  piVar13 = (int *)operator_new__(uVar10);
  this->str = piVar13;
  uVar10 = Solver::nodecount(&this->super_Solver);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar10;
  uVar10 = SUB168(auVar4 * ZEXT816(4),0);
  if (SUB168(auVar4 * ZEXT816(4),8) != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  piVar13 = (int *)operator_new__(uVar10);
  this->dvalue = piVar13;
  sVar14 = Solver::nodecount(&this->super_Solver);
  bitset::resize(&this->Z,sVar14);
  sVar14 = Solver::nodecount(&this->super_Solver);
  bitset::resize(&this->S,sVar14);
  sVar14 = Solver::nodecount(&this->super_Solver);
  bitset::resize(&this->W,sVar14);
  bitset::operator=(&this->G,(this->super_Solver).disabled);
  bitset::flip(&this->G);
  uVar10 = Solver::nodecount(&this->super_Solver);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar10;
  uVar10 = SUB168(auVar5 * ZEXT816(4),0);
  if (SUB168(auVar5 * ZEXT816(4),8) != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  piVar13 = (int *)operator_new__(uVar10);
  this->Candidates = piVar13;
  sVar14 = Solver::nodecount(&this->super_Solver);
  bitset::resize(&this->Player,sVar14);
  for (local_84 = 0; lVar15 = (long)local_84, lVar16 = Solver::nodecount(&this->super_Solver),
      lVar15 < lVar16; local_84 = local_84 + 1) {
    uVar9 = Solver::priority(&this->super_Solver,local_84);
    bitset::operator[]((bitset *)&odd_iterations,(size_t)&this->Player);
    bitset::reference::operator=((reference *)&odd_iterations,(uVar9 & 1) != 0);
  }
  puVar17 = &this->Q;
  lVar15 = Solver::nodecount(&this->super_Solver);
  local_14 = (uint)lVar15;
  (this->Q).pointer = 0;
  local_10 = puVar17;
  if ((puVar17->queue != (uint *)0x0) && (puVar17->queue != (uint *)0x0)) {
    operator_delete__(puVar17->queue);
  }
  uVar10 = SUB168(ZEXT416(local_14) * ZEXT816(4),0);
  if (SUB168(ZEXT416(local_14) * ZEXT816(4),8) != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  puVar18 = (uint *)operator_new__(uVar10);
  puVar17->queue = puVar18;
  puVar17 = &this->SQ;
  lVar15 = Solver::nodecount(&this->super_Solver);
  local_24 = (uint)lVar15;
  (this->SQ).pointer = 0;
  local_20 = puVar17;
  if ((puVar17->queue != (uint *)0x0) && (puVar17->queue != (uint *)0x0)) {
    operator_delete__(puVar17->queue);
  }
  uVar10 = SUB168(ZEXT416(local_24) * ZEXT816(4),0);
  if (SUB168(ZEXT416(local_24) * ZEXT816(4),8) != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  puVar18 = (uint *)operator_new__(uVar10);
  puVar17->queue = puVar18;
  puVar17 = &this->Zvec;
  lVar15 = Solver::nodecount(&this->super_Solver);
  local_34 = (uint)lVar15;
  (this->Zvec).pointer = 0;
  local_30 = puVar17;
  if ((puVar17->queue != (uint *)0x0) && (puVar17->queue != (uint *)0x0)) {
    operator_delete__(puVar17->queue);
  }
  uVar10 = SUB168(ZEXT416(local_34) * ZEXT816(4),0);
  if (SUB168(ZEXT416(local_34) * ZEXT816(4),8) != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  puVar18 = (uint *)operator_new__(uVar10);
  puVar17->queue = puVar18;
  puVar17 = &this->tangleto;
  lVar15 = Solver::nodecount(&this->super_Solver);
  local_44 = (uint)lVar15;
  (this->tangleto).pointer = 0;
  local_40 = puVar17;
  if ((puVar17->queue != (uint *)0x0) && (puVar17->queue != (uint *)0x0)) {
    operator_delete__(puVar17->queue);
  }
  uVar10 = SUB168(ZEXT416(local_44) * ZEXT816(4),0);
  if (SUB168(ZEXT416(local_44) * ZEXT816(4),8) != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  puVar18 = (uint *)operator_new__(uVar10);
  puVar17->queue = puVar18;
  sVar14 = Solver::nodecount(&this->super_Solver);
  bitset::resize(&this->escapes,sVar14);
  puVar17 = &this->pea_vS;
  lVar15 = Solver::nodecount(&this->super_Solver);
  local_54 = (uint)lVar15;
  (this->pea_vS).pointer = 0;
  local_50 = puVar17;
  if ((puVar17->queue != (uint *)0x0) && (puVar17->queue != (uint *)0x0)) {
    operator_delete__(puVar17->queue);
  }
  uVar10 = SUB168(ZEXT416(local_54) * ZEXT816(4),0);
  if (SUB168(ZEXT416(local_54) * ZEXT816(4),8) != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  puVar18 = (uint *)operator_new__(uVar10);
  puVar17->queue = puVar18;
  puVar17 = &this->pea_iS;
  lVar15 = Solver::nodecount(&this->super_Solver);
  local_64 = (uint)lVar15;
  (this->pea_iS).pointer = 0;
  local_60 = puVar17;
  if ((puVar17->queue != (uint *)0x0) && (puVar17->queue != (uint *)0x0)) {
    operator_delete__(puVar17->queue);
  }
  uVar10 = SUB168(ZEXT416(local_64) * ZEXT816(4),0);
  if (SUB168(ZEXT416(local_64) * ZEXT816(4),8) != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  puVar18 = (uint *)operator_new__(uVar10);
  puVar17->queue = puVar18;
  puVar17 = &this->pea_S;
  lVar15 = Solver::nodecount(&this->super_Solver);
  this_local._4_4_ = (uint)lVar15;
  (this->pea_S).pointer = 0;
  local_70 = puVar17;
  if ((puVar17->queue != (uint *)0x0) && (puVar17->queue != (uint *)0x0)) {
    operator_delete__(puVar17->queue);
  }
  uVar10 = SUB168(ZEXT416(this_local._4_4_) * ZEXT816(4),0);
  if (SUB168(ZEXT416(this_local._4_4_) * ZEXT816(4),8) != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  puVar18 = (uint *)operator_new__(uVar10);
  puVar17->queue = puVar18;
  uVar10 = Solver::nodecount(&this->super_Solver);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar10;
  uVar10 = SUB168(auVar6 * ZEXT816(4),0);
  if (SUB168(auVar6 * ZEXT816(4),8) != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  puVar19 = (uint *)operator_new__(uVar10);
  this->pea_vidx = puVar19;
  sVar14 = Solver::nodecount(&this->super_Solver);
  bitset::resize(&this->pea_root,sVar14);
  iStack_9c = 0;
  local_a0 = 0;
  if ((this->interleaved & 1U) == 0) {
    do {
      bVar7 = bitset::any(&this->G);
      if (!bVar7) break;
      if ((this->super_Solver).trace != 0) {
        poVar20 = std::operator<<((this->super_Solver).logger,
                                  "\x1b[1;38;5;196miteration\x1b[m \x1b[1;36m");
        poVar20 = (ostream *)std::ostream::operator<<(poVar20,this->iterations);
        std::operator<<(poVar20,"-even\x1b[m\n");
      }
      this->iterations = this->iterations + 1;
      iStack_9c = iStack_9c + 1;
      bVar7 = search(this,0);
    } while (bVar7);
    do {
      bVar7 = bitset::any(&this->G);
      if (!bVar7) break;
      if ((this->super_Solver).trace != 0) {
        poVar20 = std::operator<<((this->super_Solver).logger,
                                  "\x1b[1;38;5;196miteration\x1b[m \x1b[1;36m");
        poVar20 = (ostream *)std::ostream::operator<<(poVar20,this->iterations);
        std::operator<<(poVar20,"-odd\x1b[m\n");
      }
      this->iterations = this->iterations + 1;
      local_a0 = local_a0 + 1;
      bVar7 = search(this,1);
    } while (bVar7);
  }
  else {
    while( true ) {
      this->iterations = this->iterations + 1;
      bVar7 = bitset::any(&this->G);
      if (!bVar7) break;
      if ((this->super_Solver).trace != 0) {
        poVar20 = std::operator<<((this->super_Solver).logger,
                                  "\x1b[1;38;5;196miteration\x1b[m \x1b[1;36m");
        poVar20 = (ostream *)std::ostream::operator<<(poVar20,this->iterations + -1);
        std::operator<<(poVar20,"-even\x1b[m\n");
      }
      bVar7 = search(this,0);
      bVar8 = bitset::any(&this->G);
      if (!bVar8) break;
      if ((this->super_Solver).trace != 0) {
        poVar20 = std::operator<<((this->super_Solver).logger,
                                  "\x1b[1;38;5;196miteration\x1b[m \x1b[1;36m");
        poVar20 = (ostream *)std::ostream::operator<<(poVar20,this->iterations + -1);
        std::operator<<(poVar20,"-odd\x1b[m\n");
      }
      bVar8 = search(this,1);
      if ((!bVar7) && (!bVar8)) {
        pEVar22 = (Error *)__cxa_allocate_exception(0x40);
        Error::Error(pEVar22,"solver stuck",
                     "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/dtl.cpp"
                     ,0x470);
        __cxa_throw(pEVar22,&Error::typeinfo,Error::~Error);
      }
    }
  }
  poVar20 = std::operator<<((this->super_Solver).logger,"found ");
  poVar20 = (ostream *)std::ostream::operator<<(poVar20,this->dominions);
  poVar20 = std::operator<<(poVar20," dominions and ");
  poVar20 = (ostream *)std::ostream::operator<<(poVar20,this->tangles);
  std::operator<<(poVar20," tangles.\n");
  poVar20 = std::operator<<((this->super_Solver).logger,"solved in ");
  poVar20 = (ostream *)std::ostream::operator<<(poVar20,this->iterations);
  poVar20 = std::operator<<(poVar20," iterations and ");
  poVar20 = (ostream *)std::ostream::operator<<(poVar20,this->steps);
  std::operator<<(poVar20," pruning steps.\n");
  poVar20 = std::operator<<((this->super_Solver).logger,"odd iterations: ");
  pvVar21 = (void *)std::ostream::operator<<(poVar20,local_a0);
  std::ostream::operator<<(pvVar21,std::endl<char,std::char_traits<char>>);
  poVar20 = std::operator<<((this->super_Solver).logger,"even iterations: ");
  pvVar21 = (void *)std::ostream::operator<<(poVar20,iStack_9c);
  std::ostream::operator<<(pvVar21,std::endl<char,std::char_traits<char>>);
  __range1._0_4_ = 0;
  while( true ) {
    lVar15 = Solver::nodecount(&this->super_Solver);
    if (lVar15 <= (int)__range1) {
      __end1 = std::vector<int_*,_std::allocator<int_*>_>::begin(&this->tv);
      x = (int **)std::vector<int_*,_std::allocator<int_*>_>::end(&this->tv);
      while (bVar7 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_>
                                         *)&x), bVar7) {
        ppiVar23 = __gnu_cxx::__normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_>
                   ::operator*(&__end1);
        if (*ppiVar23 != (int *)0x0) {
          operator_delete__(*ppiVar23);
        }
        __gnu_cxx::__normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_>::
        operator++(&__end1);
      }
      __end1_1 = std::vector<int_*,_std::allocator<int_*>_>::begin(&this->tout);
      x_1 = (int **)std::vector<int_*,_std::allocator<int_*>_>::end(&this->tout);
      while (bVar7 = __gnu_cxx::operator!=
                               (&__end1_1,
                                (__normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_>
                                 *)&x_1), bVar7) {
        ppiVar23 = __gnu_cxx::__normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_>
                   ::operator*(&__end1_1);
        if (*ppiVar23 != (int *)0x0) {
          operator_delete__(*ppiVar23);
        }
        __gnu_cxx::__normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_>::
        operator++(&__end1_1);
      }
      pvVar24 = this->tin;
      if (pvVar24 != (vector<int,_std::allocator<int>_> *)0x0) {
        piVar1 = pvVar24[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        this_00 = pvVar24 + (long)piVar1;
        while (pvVar24 != this_00) {
          this_00 = this_00 + -1;
          std::vector<int,_std::allocator<int>_>::~vector(this_00);
        }
        operator_delete__(&pvVar24[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(long)piVar1 * 0x18 + 8);
      }
      if (this->str != (int *)0x0) {
        operator_delete__(this->str);
      }
      if (this->pea_vidx != (uint *)0x0) {
        operator_delete__(this->pea_vidx);
      }
      if (this->Candidates != (int *)0x0) {
        operator_delete__(this->Candidates);
      }
      if (this->dvalue != (int *)0x0) {
        operator_delete__(this->dvalue);
      }
      return;
    }
    bVar7 = bitset::operator[]((this->super_Solver).disabled,(long)(int)__range1);
    if (!bVar7) break;
    __range1._0_4_ = (int)__range1 + 1;
  }
  pEVar22 = (Error *)__cxa_allocate_exception(0x40);
  Error::Error(pEVar22,"search was incomplete!",
               "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/dtl.cpp"
               ,0x47d);
  __cxa_throw(pEVar22,&Error::typeinfo,Error::~Error);
}

Assistant:

void
DTLSolver::run()
{
    tin = new std::vector<int>[nodecount()];
    str = new int[nodecount()];

    dvalue = new int[nodecount()];

    Z.resize(nodecount());
    S.resize(nodecount());
    W.resize(nodecount());
    G = disabled;
    G.flip();

    Candidates = new int[nodecount()];

    Player.resize(nodecount());
    for (int v=0; v<nodecount(); v++) Player[v] = priority(v)&1;

    Q.resize(nodecount());
    SQ.resize(nodecount());

    Zvec.resize(nodecount());
    tangleto.resize(nodecount());
    escapes.resize(nodecount());

    pea_vS.resize(nodecount());
    pea_iS.resize(nodecount());
    pea_S.resize(nodecount());
    pea_vidx = new unsigned int[nodecount()];
    pea_root.resize(nodecount());

    int even_iterations = 0;
    int odd_iterations = 0;

    if (!interleaved) {
        // First solve for player Odd, then solve for player Even

        while (G.any()) {
            if (trace) logger << "\033[1;38;5;196miteration\033[m \033[1;36m" << iterations << "-even\033[m\n";
            iterations++;
            even_iterations++;
            if (!search(0)) break;
        }

        while (G.any()) {
            if (trace) logger << "\033[1;38;5;196miteration\033[m \033[1;36m" << iterations << "-odd\033[m\n";
            iterations++;
            odd_iterations++;
            if (!search(1)) break;
        }
    } else {
        // Interleave solving for player Even and player Odd

        while (true) {
            iterations++;

            if (!G.any()) break;
            if (trace) logger << "\033[1;38;5;196miteration\033[m \033[1;36m" << iterations-1 << "-even\033[m\n";
            bool found0 = search(0);

            if (!G.any()) break;
            if (trace) logger << "\033[1;38;5;196miteration\033[m \033[1;36m" << iterations-1 << "-odd\033[m\n";
            bool found1 = search(1);

            if (!found0 and !found1) THROW_ERROR("solver stuck");
            
        }
    }

    logger << "found " << dominions << " dominions and "<< tangles << " tangles.\n";
    logger << "solved in " << iterations << " iterations and " << steps << " pruning steps.\n";
    logger << "odd iterations: " << odd_iterations << std::endl;
    logger << "even iterations: " << even_iterations << std::endl;

#ifndef NDEBUG
    // Check if the whole game is now solved
    for (int i=0; i<nodecount(); i++) {
        if (!disabled[i]) { THROW_ERROR("search was incomplete!"); }
    }
#endif

    // Free all explicitly allocated memory
    for (auto &x : tv) delete[] x;
    for (auto &x : tout) delete[] x;
    delete[] tin;
    delete[] str;
    delete[] pea_vidx;
    delete[] Candidates;
    delete[] dvalue;
}